

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

Real __thiscall amrex::MultiFab::sum_unique(MultiFab *this,int comp,bool local,Periodicity *period)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  Real RVar11;
  double dVar12;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> owner_mask;
  MFIter mfi;
  Real local_158;
  FabArray<amrex::IArrayBox> *local_150;
  long local_148;
  long local_140;
  ulong local_138;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  uVar1 = 0;
  switch((this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar1 = (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
            m_indexType.m_typ.itype;
    break;
  default:
    uVar1 = (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
            m_bndryReg.m_typ.itype;
  }
  if (uVar1 == 0) {
    RVar11 = sum(this,comp,false);
    return RVar11;
  }
  local_90.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_90.fabArray._0_4_ = 0;
  amrex::OwnerMask((amrex *)&local_150,(FabArrayBase *)this,period,(IntVect *)&local_90);
  MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
  local_158 = 0.0;
  if (local_90.currentIndex < local_90.endIndex) {
    local_148 = (long)comp << 3;
    local_158 = 0.0;
    do {
      MFIter::tilebox(&local_12c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&this->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d0,local_150,&local_90);
      lVar2 = (long)local_12c.smallend.vect[2];
      dVar10 = 0.0;
      if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
        local_138 = (ulong)(uint)local_12c.bigend.vect[1];
        lVar3 = (long)local_12c.smallend.vect[1];
        local_140 = local_110.kstride * 8;
        lVar5 = local_110.nstride * local_148 +
                (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                (lVar2 - local_110.begin.z) * local_140 + (long)local_12c.smallend.vect[0] * 8 +
                (long)local_110.begin.x * -8 + (long)local_110.p;
        lVar9 = (lVar3 - local_d0.begin.y) * local_d0.jstride * 4 +
                (lVar2 - local_d0.begin.z) * local_d0.kstride * 4 +
                (long)local_12c.smallend.vect[0] * 4 + (long)local_d0.begin.x * -4 +
                (long)local_d0.p;
        do {
          lVar4 = lVar9;
          lVar6 = lVar3;
          lVar8 = lVar5;
          if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
            do {
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                lVar7 = 0;
                do {
                  if (*(int *)(lVar4 + lVar7 * 4) == 0) {
                    dVar12 = 0.0;
                  }
                  else {
                    dVar12 = *(double *)(lVar8 + lVar7 * 8);
                  }
                  dVar10 = dVar10 + dVar12;
                  lVar7 = lVar7 + 1;
                } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar7);
              }
              lVar6 = lVar6 + 1;
              lVar8 = lVar8 + local_110.jstride * 8;
              lVar4 = lVar4 + local_d0.jstride * 4;
            } while (local_12c.bigend.vect[1] + 1U != (int)lVar6);
          }
          lVar2 = lVar2 + 1;
          lVar5 = lVar5 + local_140;
          lVar9 = lVar9 + local_d0.kstride * 4;
        } while (local_12c.bigend.vect[2] + 1 != (int)lVar2);
      }
      local_158 = local_158 + dVar10;
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  if (local_150 != (FabArray<amrex::IArrayBox> *)0x0) {
    (*(local_150->super_FabArrayBase)._vptr_FabArrayBase[1])();
  }
  return local_158;
}

Assistant:

Real
MultiFab::sum_unique (int comp,
                      bool local,
                      const Periodicity& period) const
{
    BL_PROFILE("MultiFab::sum_unique()");

    // no duplicatly distributed points if cell centered
    if (ixType().cellCentered())
        return this->sum(comp, local);

    // Owner is the grid with the lowest grid number containing the data
    std::unique_ptr<iMultiFab> owner_mask = OwnerMask(period);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& msk = owner_mask->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this, IntVect(0),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                       -> GpuTuple<Real>
        {
            return msk[box_no](i,j,k) ? ma[box_no](i,j,k,comp) : 0.0_rt;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Array4<Real const> const& a = this->const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            Real tmp = 0.0_rt;
            AMREX_LOOP_3D(bx, i, j, k,
            {
                tmp += msk(i,j,k) ? a(i,j,k,comp) : 0.0_rt;
            });
            sm += tmp; // Do it this way so that it does not break regression tests.
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}